

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-direct-setter.h
# Opt level: O2

DirectSetter<dynamicgraph::Tracer,_int> * __thiscall
dynamicgraph::command::DirectSetter<dynamicgraph::Tracer,_int>::doExecute
          (DirectSetter<dynamicgraph::Tracer,_int> *this)

{
  int iVar1;
  long in_RSI;
  EitherType aEStack_28 [8];
  
  dynamicgraph::command::Command::getParameterValues();
  dynamicgraph::command::Value::value();
  iVar1 = dynamicgraph::command::EitherType::operator_cast_to_int(aEStack_28);
  dynamicgraph::command::EitherType::~EitherType(aEStack_28);
  **(int **)(in_RSI + 0x60) = iVar1;
  dynamicgraph::command::Value::Value((Value *)this);
  return this;
}

Assistant:

virtual Value doExecute() {
    const std::vector<Value> &values = getParameterValues();
    T val = values[0].value();
    (*T_ptr) = val;
    return Value();  // void
  }